

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.cpp
# Opt level: O0

ostream * arangodb::velocypack::operator<<(ostream *stream,Slice *slice)

{
  ValueType type;
  ostream *poVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  ostream *in_RDI;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffff90;
  string local_30 [40];
  ostream *local_8;
  
  local_8 = in_RDI;
  poVar1 = std::operator<<(in_RDI,"[Slice ");
  type = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::type
                   (in_stack_ffffffffffffff90);
  pcVar2 = valueTypeName(type);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1," (");
  SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::hexType_abi_cxx11_
            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)poVar1);
  poVar1 = std::operator<<(poVar1,local_30);
  poVar1 = std::operator<<(poVar1,"), byteSize: ");
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                   (in_stack_ffffffffffffff90);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ulong)this);
  std::operator<<(poVar1,"]");
  std::__cxx11::string::~string(this);
  return local_8;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, Slice const* slice) {
  stream << "[Slice " << valueTypeName(slice->type()) << " ("
         << slice->hexType() << "), byteSize: " << slice->byteSize() << "]";
  return stream;
}